

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# univalue.cpp
# Opt level: O0

UniValue * __thiscall UniValue::operator[](UniValue *this,string *key)

{
  long lVar1;
  bool bVar2;
  vector<UniValue,_std::allocator<UniValue>_> *in_RSI;
  size_t *in_RDI;
  long in_FS_OFFSET;
  size_t index;
  string *in_stack_ffffffffffffffe8;
  UniValue *pUVar3;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if ((int)*in_RDI == 1) {
    bVar2 = findKey((UniValue *)0x0,in_stack_ffffffffffffffe8,in_RDI);
    if (bVar2) {
      pUVar3 = std::vector<UniValue,_std::allocator<UniValue>_>::at(in_RSI,(size_type)in_RDI);
    }
    else {
      pUVar3 = &NullUniValue;
    }
  }
  else {
    pUVar3 = &NullUniValue;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return pUVar3;
  }
  __stack_chk_fail();
}

Assistant:

const UniValue& UniValue::operator[](const std::string& key) const
{
    if (typ != VOBJ)
        return NullUniValue;

    size_t index = 0;
    if (!findKey(key, index))
        return NullUniValue;

    return values.at(index);
}